

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

uint __thiscall
Imath_3_2::Box<Imath_3_2::Vec4<double>_>::majorAxis(Box<Imath_3_2::Vec4<double>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  uint i;
  ulong uVar3;
  Vec4<double> s;
  
  size(&s,this);
  uVar2 = 0;
  for (uVar3 = 1; uVar3 != 4; uVar3 = uVar3 + 1) {
    uVar1 = uVar3 & 0xffffffff;
    if ((&s.x)[uVar3] < (&s.x)[(int)(uint)uVar2] || (&s.x)[uVar3] == (&s.x)[(int)(uint)uVar2]) {
      uVar1 = uVar2;
    }
    uVar2 = uVar1;
  }
  return (uint)uVar2;
}

Assistant:

unsigned int
Box<V>::majorAxis () const IMATH_NOEXCEPT
{
    unsigned int major = 0;
    V            s     = size ();

    for (unsigned int i = 1; i < min.dimensions (); i++)
    {
        if (s[i] > s[major]) major = i;
    }

    return major;
}